

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O1

ngx_int_t ngx_radix128tree_insert(ngx_radix_tree_t *tree,u_char *key,u_char *mask,uintptr_t value)

{
  bool bVar1;
  ngx_radix_node_t *pnVar2;
  ngx_radix_node_t *pnVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  
  pnVar3 = tree->root;
  pnVar2 = pnVar3;
  if ((char)*mask < '\0') {
    bVar4 = 0x80;
    lVar6 = 0;
    do {
      pnVar3 = (&pnVar2->right)[(key[lVar6] & bVar4) == 0];
      if (pnVar3 == (ngx_radix_node_t *)0x0) {
        pnVar3 = (ngx_radix_node_t *)0x0;
        bVar5 = bVar4;
        break;
      }
      bVar5 = bVar4 >> 1;
      bVar1 = bVar4 < 2;
      bVar4 = bVar5;
      pnVar2 = pnVar3;
      if (bVar1) {
        lVar6 = lVar6 + 1;
        bVar4 = 0x80;
        if (lVar6 == 0x10) {
          lVar6 = 0x10;
          break;
        }
      }
      bVar5 = bVar4;
    } while ((mask[lVar6] & bVar4) != 0);
  }
  else {
    bVar5 = 0x80;
    lVar6 = 0;
  }
  if (pnVar3 == (ngx_radix_node_t *)0x0) {
    bVar4 = mask[lVar6] & bVar5;
    while (bVar4 != 0) {
      pnVar3 = ngx_radix_alloc(tree);
      if (pnVar3 == (ngx_radix_node_t *)0x0) {
        return -1;
      }
      pnVar3->right = (ngx_radix_node_t *)0x0;
      pnVar3->left = (ngx_radix_node_t *)0x0;
      pnVar3->parent = pnVar2;
      pnVar3->value = 0xffffffffffffffff;
      (&pnVar2->right)[(key[lVar6] & bVar5) == 0] = pnVar3;
      pnVar2 = pnVar3;
      if (bVar5 < 2) {
        lVar6 = lVar6 + 1;
        bVar5 = 0x80;
        if (lVar6 == 0x10) break;
      }
      else {
        bVar5 = bVar5 >> 1;
      }
      bVar4 = mask[lVar6] & bVar5;
    }
  }
  else if (pnVar2->value != 0xffffffffffffffff) {
    return -3;
  }
  pnVar2->value = value;
  return 0;
}

Assistant:

ngx_int_t
ngx_radix128tree_insert(ngx_radix_tree_t *tree, u_char *key, u_char *mask,
    uintptr_t value)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node, *next;

    i = 0;
    bit = 0x80;

    node = tree->root;
    next = tree->root;

    while (bit & mask[i]) {
        if (key[i] & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask[i]) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key[i] & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    node->value = value;

    return NGX_OK;
}